

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O3

UINT16 __thiscall
VGMPlayer::GetChipVolume(VGMPlayer *this,UINT8 chipType,UINT8 chipID,UINT8 isLinked)

{
  ushort uVar1;
  pointer pXVar2;
  UINT32 UVar3;
  long lVar4;
  long lVar5;
  UINT16 UVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  
  UVar6 = 0;
  if (chipType < 0x2a) {
    uVar1 = _CHIP_VOLUME[chipType];
    UVar3 = GetHeaderChipClock(this,chipType);
    uVar9 = ((UVar3 >> 0x1e & 1) != 0) + 1;
    if (UVar3 == 0) {
      uVar9 = 0;
    }
    uVar8 = 1;
    if (-1 < (int)UVar3) {
      uVar8 = uVar9;
    }
    if (chipType != '\0') {
      uVar8 = uVar9;
    }
    uVar1 = uVar1 >> (chipType == '\x06' && isLinked != '\0');
    uVar9 = (uint)uVar1;
    if (1 < uVar8) {
      uVar9 = uVar1 / uVar8;
    }
    bVar7 = isLinked << 7 | chipType;
    pXVar2 = (this->_xHdrChipVol).
             super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->_xHdrChipVol).
                  super__Vector_base<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pXVar2;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 2;
      lVar5 = 0;
      do {
        if ((pXVar2[lVar5].type == bVar7) && ((pXVar2[lVar5].flags & 1) == chipID)) {
          uVar1 = pXVar2[lVar5].data;
          if ((short)uVar1 < 0) {
            uVar9 = uVar9 * (uVar1 & 0x7fff) + 0x80 >> 8;
          }
          else {
            uVar9 = (uint)uVar1;
          }
          break;
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
    UVar6 = (UINT16)uVar9;
    if (bVar7 == 0x1c) {
      UVar6 = (UINT16)((ulong)((uVar9 & 0xffff) * 2 + 1) * 0x55555556 >> 0x20);
    }
    else if (bVar7 == 0x19) {
      UVar6 = (UINT16)((ulong)((uVar9 & 0xffff) << 3) * 0x33333334 >> 0x20);
    }
  }
  return UVar6;
}

Assistant:

UINT16 VGMPlayer::GetChipVolume(UINT8 chipType, UINT8 chipID, UINT8 isLinked) const
{
	if (chipType >= _CHIP_COUNT)
		return 0;
	
	size_t curChip;
	UINT16 numChips;
	UINT16 vol = _CHIP_VOLUME[chipType];
	
	numChips = GetChipCount(chipType);
	if (chipType == 0x00)
	{
		// The T6W28 consists of 2 "half" chips, so we need to treat it as 1.
		if (GetHeaderChipClock(chipType) & 0x80000000)
			numChips = 1;
	}
	
	if (isLinked)
	{
		if (chipType == 0x06)
			vol /= 2;	// the YM2203's SSG should be half as loud as the FM part
	}
	if (numChips > 1)
		vol /= numChips;
	
	chipType = (isLinked << 7) | (chipType & 0x7F);
	for (curChip = 0; curChip < _xHdrChipVol.size(); curChip ++)
	{
		const XHDR_DATA16& cData = _xHdrChipVol[curChip];
		if (cData.type == chipType && (cData.flags & 0x01) == chipID)
		{
			// Bit 15 - absolute/relative volume
			//	0 - absolute
			//	1 - relative (0x0100 = 1.0, 0x80 = 0.5, etc.)
			if (cData.data & 0x8000)
				vol = MulFixed8x8(vol, cData.data & 0x7FFF);
			else
				vol = cData.data;
			break;
		}
	}
	
	// additional patches for adjusted volume scale in sound cores
	if (chipType == 0x19)	// K051649
		vol = vol * 8 / 5;
	else if (chipType == 0x1C)	// C140/C219
		vol = (vol * 2 + 1) / 3;
	return vol;
}